

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

void nn_global_unlock_all_sockets(void)

{
  int iVar1;
  nn_ctx *self;
  long lVar2;
  
  iVar1 = nn_is_glock_held();
  if (iVar1 != 0) {
    if ((::self.socks != (nn_sock **)0x0) && (::self.nsocks != 0)) {
      for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 1) {
        if (::self.socks[lVar2] != (nn_sock *)0x0) {
          self = nn_sock_getctx(::self.socks[lVar2]);
          nn_ctx_leave(self);
        }
      }
    }
    return;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_is_glock_held()",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/global.c"
          ,0x4b4);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_global_unlock_all_sockets (void)
{
    int i;
    nn_assert(nn_is_glock_held());

    if (self.socks && self.nsocks) {
        for (i = 0; i != NN_MAX_SOCKETS; ++i)
            if (self.socks [i])
                nn_ctx_leave (nn_sock_getctx (self.socks [i]));
    }
}